

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

void __thiscall
ipx::Model::CorrectScaledBasicSolution
          (Model *this,Vector *x,Vector *slack,Vector *y,Vector *z,
          vector<int,_std::allocator<int>_> *cbasis,vector<int,_std::allocator<int>_> *vbasis)

{
  int iVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  ulong uVar5;
  double *pdVar6;
  ulong uVar7;
  double *pdVar8;
  double dVar9;
  
  pdVar2 = z->_M_data;
  pdVar3 = (this->scaled_ubuser_)._M_data;
  pdVar6 = x->_M_data;
  pdVar4 = (this->scaled_lbuser_)._M_data;
  uVar7 = 0;
  uVar5 = (ulong)(uint)this->num_var_;
  if (this->num_var_ < 1) {
    uVar5 = uVar7;
  }
  do {
    if (uVar5 == uVar7) {
      pdVar2 = y->_M_data;
      pdVar3 = slack->_M_data;
      uVar7 = 0;
      uVar5 = (ulong)(uint)this->num_constr_;
      if (this->num_constr_ < 1) {
        uVar5 = uVar7;
      }
      for (; uVar5 != uVar7; uVar7 = uVar7 + 1) {
        iVar1 = (cbasis->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar7];
        pdVar6 = pdVar3;
        if ((iVar1 == -1) || (pdVar6 = pdVar2, iVar1 == 0)) {
          pdVar6[uVar7] = 0.0;
        }
      }
      return;
    }
    iVar1 = (vbasis->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start[uVar7];
    if (iVar1 == 0) {
      dVar9 = 0.0;
      pdVar8 = pdVar2;
LAB_00389fb7:
      pdVar8[uVar7] = dVar9;
    }
    else {
      pdVar8 = pdVar4;
      if ((iVar1 == -1) || (pdVar8 = pdVar3, iVar1 == -2)) {
        dVar9 = pdVar8[uVar7];
        pdVar8 = pdVar6;
        goto LAB_00389fb7;
      }
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void Model::CorrectScaledBasicSolution(Vector& x, Vector& slack, Vector& y,
                                       Vector& z,
                                       const std::vector<Int> cbasis,
                                       const std::vector<Int> vbasis) const {
    for (Int j = 0; j < num_var_; j++) {
        if (vbasis[j] == IPX_nonbasic_lb)
            x[j] = scaled_lbuser_[j];
        if (vbasis[j] == IPX_nonbasic_ub)
            x[j] = scaled_ubuser_[j];
        if (vbasis[j] == IPX_basic)
            z[j] = 0.0;
    }
    for (Int i = 0; i < num_constr_; i++) {
        if (cbasis[i] == IPX_nonbasic)
            slack[i] = 0.0;
        if (cbasis[i] == IPX_basic)
            y[i] = 0.0;
    }
}